

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

Curl_tree * Curl_splaygetbest(timeval i,Curl_tree *t,Curl_tree **removed)

{
  long lVar1;
  long lVar2;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  Curl_tree *local_38;
  Curl_tree *x;
  Curl_tree **removed_local;
  Curl_tree *t_local;
  timeval i_local;
  
  lVar1 = i.tv_usec;
  lVar2 = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    *removed = (Curl_tree *)0x0;
    i_local.tv_usec = 0;
  }
  else {
    removed_local = &Curl_splay(i,t)->smaller;
    if (lVar2 < (((Curl_tree *)removed_local)->key).tv_sec) {
      local_3c = 0xffffffff;
    }
    else {
      if ((((Curl_tree *)removed_local)->key).tv_sec < lVar2) {
        local_40 = 1;
      }
      else {
        if (lVar1 < (((Curl_tree *)removed_local)->key).tv_usec) {
          local_44 = 0xffffffff;
        }
        else {
          local_44 = (uint)((((Curl_tree *)removed_local)->key).tv_usec < lVar1);
        }
        local_40 = local_44;
      }
      local_3c = local_40;
    }
    if ((int)local_3c < 0) {
      if (((Curl_tree *)removed_local)->smaller == (Curl_tree *)0x0) {
        *removed = (Curl_tree *)0x0;
        return (Curl_tree *)removed_local;
      }
      removed_local =
           &Curl_splay(((Curl_tree *)removed_local)->smaller->key,(Curl_tree *)removed_local)->
            smaller;
    }
    if (lVar2 < (long)removed_local[3]) {
      local_48 = 0xffffffff;
    }
    else {
      if ((long)removed_local[3] < lVar2) {
        local_4c = 1;
      }
      else {
        if (lVar1 < (long)removed_local[4]) {
          local_50 = 0xffffffff;
        }
        else {
          local_50 = (uint)((long)removed_local[4] < lVar1);
        }
        local_4c = local_50;
      }
      local_48 = local_4c;
    }
    if ((int)local_48 < 0) {
      *removed = (Curl_tree *)0x0;
      i_local.tv_usec = (__suseconds_t)removed_local;
    }
    else {
      i_local.tv_usec = (__suseconds_t)removed_local[2];
      if ((Curl_tree *)i_local.tv_usec == (Curl_tree *)0x0) {
        if (*removed_local == (Curl_tree *)0x0) {
          local_38 = removed_local[1];
        }
        else {
          local_38 = Curl_splay(i,*removed_local);
          local_38->larger = removed_local[1];
        }
        *removed = (Curl_tree *)removed_local;
        i_local.tv_usec = (__suseconds_t)local_38;
      }
      else {
        (((Curl_tree *)i_local.tv_usec)->key).tv_sec = (__time_t)removed_local[3];
        (((Curl_tree *)i_local.tv_usec)->key).tv_usec = (__suseconds_t)removed_local[4];
        ((Curl_tree *)i_local.tv_usec)->larger = removed_local[1];
        ((Curl_tree *)i_local.tv_usec)->smaller = *removed_local;
        *removed = (Curl_tree *)removed_local;
      }
    }
  }
  return (Curl_tree *)i_local.tv_usec;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct timeval i,
                                    struct Curl_tree *t,
                                    struct Curl_tree **removed)
{
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  t = Curl_splay(i,t);
  if(compare(i, t->key) < 0) {
    /* too big node, try the smaller chain */
    if(t->smaller)
      t=Curl_splay(t->smaller->key, t);
    else {
      /* fail */
      *removed = NULL;
      return t;
    }
  }

  if(compare(i, t->key) >= 0) {               /* found it */
    /* FIRST! Check if there is a list with identical keys */
    x = t->same;
    if(x) {
      /* there is, pick one from the list */

      /* 'x' is the new root node */

      x->key = t->key;
      x->larger = t->larger;
      x->smaller = t->smaller;

      *removed = t;
      return x; /* new root */
    }

    if(t->smaller == NULL) {
      x = t->larger;
    }
    else {
      x = Curl_splay(i, t->smaller);
      x->larger = t->larger;
    }
    *removed = t;

    return x;
  }
  else {
    *removed = NULL; /* no match */
    return t;        /* It wasn't there */
  }
}